

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

void Abc_ZddPrintTest(Abc_ZddMan *p)

{
  int *pPerm;
  int b;
  int a;
  uint uVar1;
  uint uVar2;
  long lVar3;
  int pSets [3] [5];
  
  pSets[2][2] = 5;
  pSets[2][3] = 10;
  pSets[2][4] = 7;
  pSets[1][3] = 7;
  pSets[1][4] = 2;
  pSets[2][0] = 0;
  pSets[2][1] = 2;
  pSets[0][4] = 7;
  pSets[1][0] = 3;
  pSets[1][1] = 0xb;
  pSets[1][2] = 10;
  pSets[0][0] = 5;
  pSets[0][1] = 0;
  pSets[0][2] = 2;
  pSets[0][3] = 10;
  a = 0;
  for (lVar3 = 0; lVar3 != 0x3c; lVar3 = lVar3 + 0x14) {
    pPerm = (int *)((long)pSets[0] + lVar3);
    Abc_ZddPermPrint(pPerm,5);
    b = Abc_ZddBuildSet(p,pPerm,5);
    a = Abc_ZddUnion(p,a,b);
  }
  puts("Resulting set:");
  Abc_ZddPrint(p,a);
  putchar(10);
  uVar1 = Abc_ZddCountNodes(p,a);
  uVar2 = Abc_ZddCountPaths(p,a);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

void Abc_ZddPrintTest( Abc_ZddMan * p )
{
//    int nSets = 2;
//    int Size = 2;
//    int pSets[2][2] = { {5, 0}, {3, 11} };
    int nSets = 3;
    int Size = 5;
    int pSets[3][5] = { {5, 0, 2, 10, 7}, {3, 11, 10, 7, 2}, {0, 2, 5, 10, 7} };
    int i, Set, Union = 0;
    for ( i = 0; i < nSets; i++ )
    {
        Abc_ZddPermPrint( pSets[i], Size );
        Set = Abc_ZddBuildSet( p, pSets[i], Size );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "Resulting set:\n" );
    Abc_ZddPrint( p, Union );
    printf( "\n" );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    Size = 0;
}